

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# realdata_unit.c
# Opt level: O0

_Bool is_bitmap_equal_to_array(roaring_bitmap_t *bitmap,uint32_t *vals,size_t numbers)

{
  byte bVar1;
  uint64_t uVar2;
  uint32_t *a1;
  _Bool answer;
  uint32_t *arr;
  uint64_t card;
  uint32_t *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int32_t in_stack_ffffffffffffffd4;
  roaring_bitmap_t *in_stack_ffffffffffffffe0;
  
  uVar2 = roaring_bitmap_get_cardinality(in_stack_ffffffffffffffe0);
  a1 = (uint32_t *)malloc(uVar2 << 2);
  roaring_bitmap_to_uint32_array
            ((roaring_bitmap_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffc8);
  bVar1 = array_equals(a1,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8,0);
  free(a1);
  return (_Bool)(bVar1 & 1);
}

Assistant:

bool is_bitmap_equal_to_array(roaring_bitmap_t *bitmap, uint32_t *vals,
                              size_t numbers) {
    uint64_t card;
    card = roaring_bitmap_get_cardinality(bitmap);
    uint32_t *arr = (uint32_t *)malloc(card * sizeof(uint32_t));
    roaring_bitmap_to_uint32_array(bitmap, arr);
    bool answer = array_equals(arr, card, vals, numbers);
    free(arr);
    return answer;
}